

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseEncoder.cpp
# Opt level: O2

void __thiscall siamese::EncoderPacketWindow::EncoderPacketWindow(EncoderPacketWindow *this)

{
  long lVar1;
  
  (this->Subwindows).Size = 0;
  lVar1 = 0x118;
  this->TheAllocator = (Allocator *)0x0;
  this->Stats = (EncoderStats *)0x0;
  this->NextColumn = 0;
  this->Count = 0;
  this->ColumnStart = 0;
  this->LongestPacket = 0;
  this->Count = 0;
  this->ColumnStart = 0;
  this->LongestPacket = 0;
  this->FirstUnremovedElement = 0;
  this->SumStartElement = 0;
  this->SumEndElement = 0;
  this->SumColumnStart = 0;
  this->SumErasedCount = 0;
  (this->Subwindows).Allocated = 0x19;
  (this->Subwindows).DataPtr = (this->Subwindows).PreallocatedData;
  do {
    EncoderColumnLane::EncoderColumnLane
              ((EncoderColumnLane *)((long)(this->Subwindows).PreallocatedData + lVar1 + -0x38));
    lVar1 = lVar1 + 0x48;
  } while (lVar1 != 0x358);
  (this->SubwindowsShift).Size = 0;
  (this->SubwindowsShift).Allocated = 0x19;
  (this->SubwindowsShift).DataPtr = (this->SubwindowsShift).PreallocatedData;
  this->EmergencyDisabled = false;
  this->NextColumn = 0;
  this->ColumnStart = 0;
  ClearWindow(this);
  return;
}

Assistant:

EncoderPacketWindow::EncoderPacketWindow()
{
    NextColumn  = 0;
    ColumnStart = 0;

    ClearWindow();
}